

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_GetCommandLineFlagInfoTest_FlagExists::Run(void)

{
  string *__rhs;
  string *__rhs_00;
  string *__rhs_01;
  string *__rhs_02;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  FlagSaver fs;
  CommandLineFlagInfo local_100;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","GetCommandLineFlagInfoTest","FlagExists");
  local_100.name._M_dataplus._M_p = (pointer)&local_100.name.field_2;
  local_100.name._M_string_length = 0;
  local_100.name.field_2._M_local_buf[0] = '\0';
  local_100.type._M_dataplus._M_p = (pointer)&local_100.type.field_2;
  local_100.type._M_string_length = 0;
  local_100.type.field_2._M_local_buf[0] = '\0';
  local_100.description._M_dataplus._M_p = (pointer)&local_100.description.field_2;
  local_100.description._M_string_length = 0;
  local_100.description.field_2._M_local_buf[0] = '\0';
  local_100.current_value._M_dataplus._M_p = (pointer)&local_100.current_value.field_2;
  local_100.current_value._M_string_length = 0;
  local_100.current_value.field_2._M_local_buf[0] = '\0';
  local_100.default_value._M_dataplus._M_p = (pointer)&local_100.default_value.field_2;
  local_100.default_value._M_string_length = 0;
  local_100.default_value.field_2._M_local_buf[0] = '\0';
  local_100.filename._M_dataplus._M_p = (pointer)&local_100.filename.field_2;
  local_100.filename._M_string_length = 0;
  local_100.filename.field_2._M_local_buf[0] = '\0';
  bVar1 = GetCommandLineFlagInfo("test_int32",&local_100);
  if (!bVar1) {
LAB_001376d5:
    pcVar2 = "r";
    goto LAB_00137847;
  }
  bVar1 = std::operator==("test_int32",&local_100.name);
  if (bVar1) {
    __rhs = &local_100.type;
    bVar1 = std::operator==("int32",__rhs);
    if (bVar1) {
      __rhs_00 = &local_100.description;
      bVar1 = std::operator==("",__rhs_00);
      if (bVar1) {
        __rhs_01 = &local_100.current_value;
        bVar1 = std::operator==("-1",__rhs_01);
        if (bVar1) {
          __rhs_02 = &local_100.default_value;
          bVar1 = std::operator==("-1",__rhs_02);
          if (bVar1) {
            if (local_100.is_default == false) {
              pcVar2 = "info.is_default";
            }
            else {
              if (local_100.has_validator_fn != true) {
                if ((undefined4 *)local_100.flag_ptr == &fLI::FLAGS_test_int32) {
                  fLB::FLAGS_test_bool = 1;
                  bVar1 = GetCommandLineFlagInfo("test_bool",&local_100);
                  if (!bVar1) goto LAB_001376d5;
                  bVar1 = std::operator==("test_bool",&local_100.name);
                  if (!bVar1) {
LAB_00137703:
                    pcVar2 = "\"test_bool\"";
                    goto LAB_0013779f;
                  }
                  bVar1 = std::operator==("bool",__rhs);
                  if (!bVar1) {
LAB_0013771a:
                    pcVar2 = "\"bool\"";
                    goto LAB_001377c4;
                  }
                  bVar1 = std::operator==("tests bool-ness",__rhs_00);
                  if (!bVar1) {
LAB_00137731:
                    pcVar2 = "\"tests bool-ness\"";
                    goto LAB_001377e9;
                  }
                  bVar1 = std::operator==("true",__rhs_01);
                  if (!bVar1) {
                    pcVar2 = "\"true\"";
                    goto LAB_00137898;
                  }
                  bVar1 = std::operator==("false",__rhs_02);
                  if (!bVar1) {
LAB_00137748:
                    pcVar2 = "\"false\"";
                    goto LAB_00137825;
                  }
                  if (local_100.is_default == true) {
LAB_0013775f:
                    pcVar2 = "!(info.is_default)";
                    goto LAB_00137847;
                  }
                  if (local_100.has_validator_fn == true) goto LAB_001376ec;
                  if ((undefined1 *)local_100.flag_ptr == &fLB::FLAGS_test_bool) {
                    fLB::FLAGS_test_bool = 0;
                    bVar1 = GetCommandLineFlagInfo("test_bool",&local_100);
                    if (!bVar1) goto LAB_001376d5;
                    bVar1 = std::operator==("test_bool",&local_100.name);
                    if (!bVar1) goto LAB_00137703;
                    bVar1 = std::operator==("bool",__rhs);
                    if (!bVar1) goto LAB_0013771a;
                    bVar1 = std::operator==("tests bool-ness",__rhs_00);
                    if (!bVar1) goto LAB_00137731;
                    bVar1 = std::operator==("false",__rhs_01);
                    if (!bVar1) {
                      pcVar2 = "\"false\"";
                      goto LAB_00137898;
                    }
                    bVar1 = std::operator==("false",__rhs_02);
                    if (!bVar1) goto LAB_00137748;
                    if (local_100.is_default == true) goto LAB_0013775f;
                    if (local_100.has_validator_fn == true) goto LAB_001376ec;
                    if ((undefined1 *)local_100.flag_ptr == &fLB::FLAGS_test_bool) {
                      CommandLineFlagInfo::~CommandLineFlagInfo(&local_100);
                      FlagSaver::~FlagSaver(&fs);
                      return;
                    }
                  }
                  pcVar2 = "&FLAGS_test_bool";
                }
                else {
                  pcVar2 = "&FLAGS_test_int32";
                }
                pcVar3 = "info.flag_ptr";
                goto LAB_001378a6;
              }
LAB_001376ec:
              pcVar2 = "!(info.has_validator_fn)";
            }
LAB_00137847:
            fprintf(_stderr,"Check failed: %s\n",pcVar2);
            goto LAB_001378ad;
          }
          pcVar2 = "\"-1\"";
LAB_00137825:
          pcVar3 = "info.default_value";
        }
        else {
          pcVar2 = "\"-1\"";
LAB_00137898:
          pcVar3 = "info.current_value";
        }
      }
      else {
        pcVar2 = "\"\"";
LAB_001377e9:
        pcVar3 = "info.description";
      }
    }
    else {
      pcVar2 = "\"int32\"";
LAB_001377c4:
      pcVar3 = "info.type";
    }
  }
  else {
    pcVar2 = "\"test_int32\"";
LAB_0013779f:
    pcVar3 = "info.name";
  }
LAB_001378a6:
  fprintf(_stderr,"Check failed: %s %s %s\n",pcVar2,"==",pcVar3);
LAB_001378ad:
  exit(1);
}

Assistant:

TEST(GetCommandLineFlagInfoTest, FlagExists) {
  CommandLineFlagInfo info;
  bool r = GetCommandLineFlagInfo("test_int32", &info);
  EXPECT_TRUE(r);
  EXPECT_EQ("test_int32", info.name);
  EXPECT_EQ("int32", info.type);
  EXPECT_EQ("", info.description);
  EXPECT_EQ("-1", info.current_value);
  EXPECT_EQ("-1", info.default_value);
  EXPECT_TRUE(info.is_default);
  EXPECT_FALSE(info.has_validator_fn);
  EXPECT_EQ(&FLAGS_test_int32, info.flag_ptr);

  FLAGS_test_bool = true;
  r = GetCommandLineFlagInfo("test_bool", &info);
  EXPECT_TRUE(r);
  EXPECT_EQ("test_bool", info.name);
  EXPECT_EQ("bool", info.type);
  EXPECT_EQ("tests bool-ness", info.description);
  EXPECT_EQ("true", info.current_value);
  EXPECT_EQ("false", info.default_value);
  EXPECT_FALSE(info.is_default);
  EXPECT_FALSE(info.has_validator_fn);
  EXPECT_EQ(&FLAGS_test_bool, info.flag_ptr);

  FLAGS_test_bool = false;
  r = GetCommandLineFlagInfo("test_bool", &info);
  EXPECT_TRUE(r);
  EXPECT_EQ("test_bool", info.name);
  EXPECT_EQ("bool", info.type);
  EXPECT_EQ("tests bool-ness", info.description);
  EXPECT_EQ("false", info.current_value);
  EXPECT_EQ("false", info.default_value);
  EXPECT_FALSE(info.is_default);  // value is same, but flag *was* modified
  EXPECT_FALSE(info.has_validator_fn);
  EXPECT_EQ(&FLAGS_test_bool, info.flag_ptr);
}